

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowPos(GLFWwindow *handle,int xpos,int ypos)

{
  _GLFWwindow *window;
  int ypos_local;
  int xpos_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0x253,"void glfwSetWindowPos(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (*(long *)(handle + 0x50) == 0) {
    (*_glfw.platform.setWindowPos)((_GLFWwindow *)handle,xpos,ypos);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowPos(GLFWwindow* handle, int xpos, int ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfw.platform.setWindowPos(window, xpos, ypos);
}